

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

void chi_square_noncentral_cdf_values(int *n_data,int *df,double *lambda,double *x,double *cdf)

{
  uint uVar1;
  double dVar2;
  
  uVar1 = *n_data;
  if ((int)uVar1 < 0) {
    *n_data = 1;
    uVar1 = 0;
  }
  else {
    *n_data = uVar1 + 1;
    if (0x1b < uVar1) {
      *n_data = 0;
      *x = 0.0;
      *lambda = 0.0;
      *df = 0;
      dVar2 = 0.0;
      goto LAB_00198448;
    }
  }
  *x = chi_square_noncentral_cdf_values::x_vec[uVar1];
  *lambda = chi_square_noncentral_cdf_values::lambda_vec[uVar1];
  *df = chi_square_noncentral_cdf_values::df_vec[uVar1];
  dVar2 = *(double *)(&DAT_00216778 + (long)*n_data * 8);
LAB_00198448:
  *cdf = dVar2;
  return;
}

Assistant:

void chi_square_noncentral_cdf_values ( int &n_data, int &df, double &lambda,
  double &x, double &cdf )

//****************************************************************************80
//
//  Purpose:
//
//    CHI_SQUARE_NONCENTRAL_CDF_VALUES returns values of the noncentral chi CDF.
//
//  Discussion:
//
//    In Mathematica, the function can be evaluated by:
//
//      Needs["Statistics`ContinuousDistributions`"]
//      dist = NoncentralChiSquareDistribution [ df, lambda ]
//      CDF [ dist, x ]
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    30 August 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Stephen Wolfram,
//    The Mathematica Book,
//    Fourth Edition,
//    Cambridge University Press, 1999,
//    ISBN: 0-521-64314-7,
//    LC: QA76.95.W65.
//
//  Parameters:
//
//    Input/output, int &N_DATA.  The user sets N_DATA to 0 before the
//    first call.  On each call, the routine increments N_DATA by 1, and
//    returns the corresponding data; when there is no more data, the
//    output value of N_DATA will be 0 again.
//
//    Output, int &DF, the number of degrees of freedom.
//
//    Output, double &LAMBDA, the noncentrality parameter.
//
//    Output, double &X, the argument of the function.
//
//    Output, double &CDF, the noncentral chi CDF.
//
{
# define N_MAX 28

  static double cdf_vec[N_MAX] = {
     0.8399444269398261E+00,
     0.6959060300435139E+00,
     0.5350879697078847E+00,
     0.7647841496310313E+00,
     0.6206436532195436E+00,
     0.4691667375373180E+00,
     0.3070884345937569E+00,
     0.2203818092990903E+00,
     0.1500251895581519E+00,
     0.3071163194335791E-02,
     0.1763982670131894E-02,
     0.9816792594625022E-03,
     0.1651753140866208E-01,
     0.2023419573950451E-03,
     0.4984476352854074E-06,
     0.1513252400654827E-01,
     0.2090414910614367E-02,
     0.2465021206048452E-03,
     0.2636835050342939E-01,
     0.1857983220079215E-01,
     0.1305736595486640E-01,
     0.5838039534819351E-01,
     0.4249784402463712E-01,
     0.3082137716021596E-01,
     0.1057878223400849E+00,
     0.7940842984598509E-01,
     0.5932010895599639E-01,
     0.2110395656918684E+00 };

  static int df_vec[N_MAX] = {
      1,   2,   3,
      1,   2,   3,
      1,   2,   3,
      1,   2,   3,
     60,  80, 100,
      1,   2,   3,
     10,  10,  10,
     10,  10,  10,
     10,  10,  10,
      8 };

  static double lambda_vec[N_MAX] = {
     0.5E+00,
     0.5E+00,
     0.5E+00,
     1.0E+00,
     1.0E+00,
     1.0E+00,
     5.0E+00,
     5.0E+00,
     5.0E+00,
    20.0E+00,
    20.0E+00,
    20.0E+00,
    30.0E+00,
    30.0E+00,
    30.0E+00,
     5.0E+00,
     5.0E+00,
     5.0E+00,
     2.0E+00,
     3.0E+00,
     4.0E+00,
     2.0E+00,
     3.0E+00,
     4.0E+00,
     2.0E+00,
     3.0E+00,
     4.0E+00,
     0.5E+00 };

  static double x_vec[N_MAX] = {
      3.000E+00,
      3.000E+00,
      3.000E+00,
      3.000E+00,
      3.000E+00,
      3.000E+00,
      3.000E+00,
      3.000E+00,
      3.000E+00,
      3.000E+00,
      3.000E+00,
      3.000E+00,
     60.000E+00,
     60.000E+00,
     60.000E+00,
      0.050E+00,
      0.050E+00,
      0.050E+00,
      4.000E+00,
      4.000E+00,
      4.000E+00,
      5.000E+00,
      5.000E+00,
      5.000E+00,
      6.000E+00,
      6.000E+00,
      6.000E+00,
      5.000E+00 };

  if ( n_data < 0 )
  {
    n_data = 0;
  }

  n_data = n_data + 1;

  if ( N_MAX < n_data )
  {
    n_data = 0;
    x = 0.0;
    lambda = 0.0;
    df = 0;
    cdf = 0.0;
  }
  else
  {
    x = x_vec[n_data-1];
    lambda = lambda_vec[n_data-1];
    df = df_vec[n_data-1];
    cdf = cdf_vec[n_data-1];
  }

  return;
# undef N_MAX
}